

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i,real a)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  int64_t iVar4;
  ulong uVar5;
  long lVar6;
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                  ,0x79,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  iVar4 = Matrix::size(&this->super_Matrix,0);
  if ((long)(ulong)(uint)i < iVar4) {
    pfVar1 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar2 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = Matrix::size(&this->super_Matrix,1);
    if ((long)pfVar1 - (long)pfVar2 >> 2 != iVar4) {
      __assert_fail("x.size() == this->size(1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                    ,0x7b,
                    "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                   );
    }
    iVar4 = Matrix::size(&this->super_Matrix,1);
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        uVar5 = (this->super_Matrix).n_ * (ulong)(uint)i + lVar6;
        pfVar1 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pfVar1 >> 2) <= uVar5) {
          __assert_fail("i * n_ + j < data_.size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.h"
                        ,0x2d,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
        }
        pfVar2 = (x->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)pfVar1[uVar5]),ZEXT416((uint)a),
                                 ZEXT416((uint)pfVar2[lVar6]));
        pfVar2[lVar6] = auVar3._0_4_;
        lVar6 = lVar6 + 1;
        iVar4 = Matrix::size(&this->super_Matrix,1);
      } while (lVar6 < iVar4);
    }
    return;
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/densematrix.cc"
                ,0x7a,
                "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i, real a) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < this->size(1); j++) {
    x[j] += a * at(i, j);
  }
}